

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O0

SudokuGitter * __thiscall
SudokuGitter::getSolvable(SudokuGitter *__return_storage_ptr__,SudokuGitter *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  result_type_conflict rVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  uint local_2778;
  uint local_2774;
  uint col;
  uint row;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13e8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  int local_50;
  allocator<unsigned_int> local_49;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  int globalElements;
  SudokuGitter *this_local;
  SudokuGitter *solvable;
  
  uVar1 = getElements(this);
  SudokuGitter(__return_storage_ptr__,uVar1);
  uVar1 = getElements(this);
  uVar2 = getElements(this);
  iVar3 = uVar1 * uVar2;
  std::allocator<unsigned_int>::allocator(&local_49);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)iVar3,&local_49);
  std::allocator<unsigned_int>::~allocator(&local_49);
  for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
    dVar6 = (double)local_50;
    dVar7 = ceil((double)iVar3 * 0.3);
    if (dVar7 <= dVar6) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)local_50);
      *pvVar5 = 0;
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)local_50);
      *pvVar5 = 1;
    }
  }
  local_58._M_current =
       (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  local_60._M_current =
       (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  std::random_device::random_device((random_device *)&col);
  rVar4 = std::random_device::operator()((random_device *)&col);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13e8,(ulong)rVar4);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_58,local_60,&local_13e8);
  std::random_device::~random_device((random_device *)&col);
  for (local_2774 = 0; uVar1 = getElements(this), local_2774 < uVar1; local_2774 = local_2774 + 1) {
    for (local_2778 = 0; uVar1 = getElements(this), local_2778 < uVar1; local_2778 = local_2778 + 1)
    {
      uVar1 = getElements(this);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                          (ulong)(local_2774 * uVar1 + local_2778));
      if (*pvVar5 == 1) {
        uVar1 = getCellValue(this,local_2774,local_2778);
        setCell(__return_storage_ptr__,local_2774,local_2778,uVar1);
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

SudokuGitter SudokuGitter::getSolvable() {
    SudokuGitter solvable = SudokuGitter(getElements());

    int globalElements = getElements() * getElements();

    vector<unsigned int> permutation(globalElements);

    for (int i = 0; i < globalElements; i++) {
        if (i < ceil(globalElements * 0.30))
            permutation[i] = 1;
        else
            permutation[i] = 0;
    }

    shuffle(begin(permutation), end(permutation), std::mt19937(std::random_device()()));

    for (unsigned int row = 0; row < getElements(); row++) {
        for (unsigned int col = 0; col < getElements(); col++) {
            if (permutation[row * getElements() + col] == 1)
                solvable.setCell(row, col, getCellValue(row, col));
        }
    }

    return solvable;
}